

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *__s;
  bool bVar1;
  size_t sVar2;
  ostream *poVar3;
  int i;
  int iVar4;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  Controller controller;
  string map_file_path;
  string local_2828;
  Renderer renderer;
  Game game;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&map_file_path,"",(allocator<char> *)&game);
  if (argc < 2) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "To specify a map file use the following format: ");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cout,"Usage: [executable] [-m path_to_map.map]");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::assign((char *)&map_file_path);
  }
  else {
    for (iVar4 = 1; iVar4 < argc; iVar4 = iVar4 + 1) {
      __s = argv[iVar4];
      sVar2 = strlen(__s);
      __y._M_str = "-m";
      __y._M_len = 2;
      __x._M_str = __s;
      __x._M_len = sVar2;
      bVar1 = std::operator==(__x,__y);
      if ((bVar1) && (iVar4 = iVar4 + 1, iVar4 < argc)) {
        std::__cxx11::string::assign((char *)&map_file_path);
      }
    }
  }
  Renderer::Renderer(&renderer,0x280,0x280,0x20,0x20);
  std::__cxx11::string::string((string *)&local_2828,(string *)&map_file_path);
  Game::Game(&game,0x20,0x20,&local_2828);
  std::__cxx11::string::~string((string *)&local_2828);
  Game::Run(&game,&controller,&renderer,0x10);
  std::operator<<((ostream *)&std::cout,"Game has terminated successfully!\n");
  poVar3 = std::operator<<((ostream *)&std::cout,"Score: ");
  iVar4 = Game::GetScore(&game);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar4);
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<((ostream *)&std::cout,"Size: ");
  iVar4 = Game::GetSize(&game);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar4);
  std::operator<<(poVar3,"\n");
  Game::~Game(&game);
  Renderer::~Renderer(&renderer);
  std::__cxx11::string::~string((string *)&map_file_path);
  return 0;
}

Assistant:

int main(int argc, const char **argv) {
    constexpr std::size_t kFramesPerSecond{60};
    constexpr std::size_t kMsPerFrame{1000 / kFramesPerSecond};
    constexpr std::size_t kScreenWidth{640};
    constexpr std::size_t kScreenHeight{640};
    constexpr std::size_t kGridWidth{32};
    constexpr std::size_t kGridHeight{32};

  // For taking user input for custom maps
    std::string map_file_path = "";
    if (argc > 1) {
        for (int i = 1; i < argc; ++i)
            if (std::string_view{argv[i]} == "-m" && ++i < argc)
                map_file_path = argv[i];

    } else {
        std::cout << "To specify a map file use the following format: " << std::endl;
        std::cout << "Usage: [executable] [-m path_to_map.map]" << std::endl;
        map_file_path = "../maps/map2.map";
    }

    Renderer renderer(kScreenWidth, kScreenHeight, kGridWidth, kGridHeight);
    Controller controller;
    Game game(kGridWidth, kGridHeight, map_file_path);
    game.Run(controller, renderer, kMsPerFrame);
    std::cout << "Game has terminated successfully!\n";
    std::cout << "Score: " << game.GetScore() << "\n";
    std::cout << "Size: " << game.GetSize() << "\n";
    return 0;
}